

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O2

linkedList<transaction_*> * __thiscall
linkedList<transaction_*>::operator=(linkedList<transaction_*> *this,linkedList<transaction_*> *rhs)

{
  clear(this);
  do {
    rhs = (linkedList<transaction_*> *)rhs->head;
    insert_last(this,(transaction *)rhs->_vptr_linkedList);
  } while( true );
}

Assistant:

linkedList<T> &  linkedList<T>::operator=(  linkedList<T> &rhs)
{

//        linkedList *tmp = new linkedList;

    this->clear(); // the function at the start of this review

//        if (rhs.isEmpty()) {
//            // short cut, since the other list is empty
//            linkedList<T> tmp = new linkedList<T>();
//            this = tmp;
//            return *this;
//        }


    for ( auto item : rhs) {
        this->insert_last(item);
    }
    this->size = rhs.size; //peritto

    return *this;

}